

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteBlif.c
# Opt level: O1

void Cba_ManWriteBlif(char *pFileName,Cba_Man_t *p)

{
  void *pvVar1;
  char *pcVar2;
  void *pvVar3;
  FILE *__stream;
  char *pcVar4;
  long lVar5;
  
  pvVar1 = p->pMioLib;
  if (pvVar1 != (void *)0x0) {
    pvVar3 = Abc_FrameReadLibGen();
    if (pvVar1 != pvVar3) {
      puts("Genlib library used in the mapped design is not longer a current library.");
      return;
    }
  }
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    pcVar2 = p->pName;
    pcVar4 = Extra_TimeStamp();
    fprintf(__stream,"# Design \"%s\" written via CBA package in ABC on %s\n\n",pcVar2,pcVar4);
    if (1 < (p->vNtks).nSize) {
      lVar5 = 1;
      do {
        Cba_ManWriteBlifNtk((FILE *)__stream,(Cba_Ntk_t *)(p->vNtks).pArray[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (p->vNtks).nSize);
    }
    fclose(__stream);
    return;
  }
  printf("Cannot open output file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Cba_ManWriteBlif( char * pFileName, Cba_Man_t * p )
{
    FILE * pFile;
    Cba_Ntk_t * pNtk; 
    int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Design \"%s\" written via CBA package in ABC on %s\n\n", Cba_ManName(p), Extra_TimeStamp() );
//    Cba_ManAssignInternWordNames( p );
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_ManWriteBlifNtk( pFile, pNtk );
    fclose( pFile );
}